

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O0

void add64(mbedtls_mpi_uint *dst,mbedtls_mpi_uint *src,mbedtls_mpi_uint *carry)

{
  ulong uVar1;
  bool bVar2;
  ulong local_30;
  mbedtls_mpi_uint c;
  uchar i;
  mbedtls_mpi_uint *carry_local;
  mbedtls_mpi_uint *src_local;
  mbedtls_mpi_uint *dst_local;
  
  local_30 = 0;
  bVar2 = false;
  carry_local = src;
  src_local = dst;
  while (!bVar2) {
    *src_local = local_30 + *src_local;
    uVar1 = *src_local;
    *src_local = *carry_local + *src_local;
    local_30 = (long)(int)(uint)(*src_local < *carry_local) + (long)(int)(uint)(uVar1 < local_30);
    src_local = src_local + 1;
    carry_local = carry_local + 1;
    bVar2 = true;
  }
  *carry = local_30 + *carry;
  return;
}

Assistant:

static inline void add64( mbedtls_mpi_uint *dst, mbedtls_mpi_uint *src, mbedtls_mpi_uint *carry )
{
    unsigned char i;
    mbedtls_mpi_uint c = 0;
    for( i = 0; i < 8 / sizeof( mbedtls_mpi_uint ); i++, dst++, src++ )
    {
        *dst += c;      c  = ( *dst < c );
        *dst += *src;   c += ( *dst < *src );
    }
    *carry += c;
}